

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

result __thiscall
fmt::v6::internal::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_5,bool integral)

{
  int iVar1;
  result rVar2;
  char *in_RAX;
  ulong uVar3;
  char *unaff_retaddr;
  
  if (divisor <= remainder) {
    assert_fail(unaff_retaddr,0,in_RAX);
  }
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  rVar2 = more;
  if (this->precision <= this->size) {
    if (integral) {
      if ((divisor < 3) || (error != 1)) {
        assert_fail(unaff_retaddr,0,in_RAX);
      }
    }
    else if (divisor <= error || divisor - error <= error) {
      return error;
    }
    if (divisor <= error) {
      assert_fail(unaff_retaddr,0,in_RAX);
    }
    if (divisor - error <= error) {
      assert_fail(unaff_retaddr,0,in_RAX);
    }
    if ((divisor - remainder < remainder) || (rVar2 = done, divisor + remainder * -2 < error * 2)) {
      rVar2 = error;
      if ((error <= remainder) && (divisor - (remainder - error) <= remainder - error)) {
        this->buf[(long)this->size + -1] = this->buf[(long)this->size + -1] + '\x01';
        if (1 < (long)this->size) {
          uVar3 = (long)this->size + 1;
          do {
            if (this->buf[uVar3 - 2] < ':') break;
            this->buf[uVar3 - 2] = '0';
            this->buf[uVar3 - 3] = this->buf[uVar3 - 3] + '\x01';
            uVar3 = uVar3 - 1;
          } while (2 < uVar3);
        }
        rVar2 = done;
        if ('9' < *this->buf) {
          *this->buf = '1';
          iVar1 = this->size;
          this->size = iVar1 + 1;
          this->buf[iVar1] = '0';
        }
      }
    }
  }
  return rVar2;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != round_direction::up)
      return dir == round_direction::down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      buf[size++] = '0';
    }
    return digits::done;
  }